

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::XmlUnitTestResultPrinter::OnTestIterationEnd
          (XmlUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  FILE *__stream;
  string *pathname;
  FilePath output_dir;
  FilePath output_file;
  string local_1c0;
  stringstream stream;
  ostream local_190 [376];
  
  pathname = &this->output_file_;
  FilePath::FilePath(&output_file,pathname);
  FilePath::RemoveFileName(&output_dir,&output_file);
  bVar1 = FilePath::CreateDirectoriesRecursively(&output_dir);
  if (bVar1) {
    __stream = fopen((pathname->_M_dataplus)._M_p,"w");
    if (__stream != (FILE *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&stream);
      PrintXmlUnitTest(local_190,unit_test);
      StringStreamToString(&local_1c0,&stream);
      fputs(local_1c0._M_dataplus._M_p,__stream);
      std::__cxx11::string::~string((string *)&local_1c0);
      fclose(__stream);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
      std::__cxx11::string::~string((string *)&output_dir);
      std::__cxx11::string::~string((string *)&output_file);
      return;
    }
  }
  fprintf(_stderr,"Unable to open file \"%s\"\n",(pathname->_M_dataplus)._M_p);
  fflush(_stderr);
  exit(1);
}

Assistant:

void XmlUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* xmlout = NULL;
  FilePath output_file(output_file_);
  FilePath output_dir(output_file.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    xmlout = posix::FOpen(output_file_.c_str(), "w");
  }
  if (xmlout == NULL) {
    // TODO(wan): report the reason of the failure.
    //
    // We don't do it for now as:
    //
    //   1. There is no urgent need for it.
    //   2. It's a bit involved to make the errno variable thread-safe on
    //      all three operating systems (Linux, Windows, and Mac OS).
    //   3. To interpret the meaning of errno in a thread-safe way,
    //      we need the strerror_r() function, which is not available on
    //      Windows.
    fprintf(stderr,
            "Unable to open file \"%s\"\n",
            output_file_.c_str());
    fflush(stderr);
    exit(EXIT_FAILURE);
  }
  std::stringstream stream;
  PrintXmlUnitTest(&stream, unit_test);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}